

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts_cache.hpp
# Opt level: O0

vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *
mcts::MCTS_cache<uttt::IBoard,uttt::RandomPlayout>(IBoard *game,longlong iterations)

{
  bool bVar1;
  reference ppVar2;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *in_RDI;
  pair<const_long,_std::pair<double,_long_long>_> it;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  *__range2_1;
  mapped_type *p;
  MCTSResults *r;
  iterator __end3;
  iterator __begin3;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *__range3;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> result;
  future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  *__range2;
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  um_results;
  int i;
  int num_threads;
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  futures;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *results;
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  *in_stack_fffffffffffffe98;
  mapped_type *in_stack_fffffffffffffea0;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *this;
  future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  *in_stack_fffffffffffffec8;
  _Node_iterator_base<std::pair<const_long,_std::pair<double,_long_long>_>,_false> local_130;
  _Node_iterator_base<std::pair<const_long,_std::pair<double,_long_long>_>,_false> local_128;
  undefined1 *local_120;
  undefined1 local_111;
  mapped_type *local_110;
  reference local_108;
  MCTSResults *local_100;
  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
  local_f8;
  type_conflict *in_stack_ffffffffffffff10;
  launch in_stack_ffffffffffffff1c;
  __normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
  local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [72];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  int local_38;
  int local_34;
  undefined1 local_30 [24];
  undefined8 local_18;
  undefined8 *local_10;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ::vector((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
            *)0x1f73b9);
  local_34 = std::thread::hardware_concurrency();
  for (local_38 = 0; local_38 < local_34; local_38 = local_38 + 1) {
    local_58 = local_10[2];
    local_68 = *local_10;
    uStack_60 = local_10[1];
    local_50 = local_18;
    std::
    async<mcts::MCTS_cache<uttt::IBoard,uttt::RandomPlayout>(uttt::IBoard_const&,long_long)::_lambda()_1_>
              (in_stack_ffffffffffffff1c,in_stack_ffffffffffffff10);
    std::
    vector<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>,std::allocator<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>>>
    ::emplace_back<std::future<std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>>>
              ((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
                *)this,(future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                        *)in_RDI);
    std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>::~future
              ((future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *)
               0x1f7453);
  }
  std::
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  ::unordered_map((unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
                   *)0x1f74b5);
  local_b8 = local_30;
  local_c0._M_current =
       (future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_> *)
       std::
       vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
       ::begin((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
                *)in_stack_fffffffffffffe98);
  std::
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ::end((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
         *)in_stack_fffffffffffffe98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
                             *)in_stack_fffffffffffffea0,
                            (__normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
                             *)in_stack_fffffffffffffe98), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
    ::operator*(&local_c0);
    std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>::get
              (in_stack_fffffffffffffec8);
    local_f8._M_current =
         (MCTSResults *)
         std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::begin
                   ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
                    in_stack_fffffffffffffe98);
    local_100 = (MCTSResults *)
                std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::end
                          ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
                           in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                               *)in_stack_fffffffffffffe98), bVar1) {
      local_108 = __gnu_cxx::
                  __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
                  ::operator*(&local_f8);
      in_stack_fffffffffffffea0 =
           std::
           unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
           ::operator[]((unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
                         *)in_stack_fffffffffffffea0,(key_type *)in_stack_fffffffffffffe98);
      in_stack_fffffffffffffea0->first = local_108->value + in_stack_fffffffffffffea0->first;
      in_stack_fffffffffffffea0->second = local_108->total + in_stack_fffffffffffffea0->second;
      local_110 = in_stack_fffffffffffffea0;
      __gnu_cxx::
      __normal_iterator<mcts::MCTSResults_*,_std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>
      ::operator++(&local_f8);
    }
    std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::~vector(this);
    __gnu_cxx::
    __normal_iterator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_*,_std::vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>_>
    ::operator++(&local_c0);
  }
  local_111 = 0;
  std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>::vector
            ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)0x1f7657);
  local_120 = local_b0;
  local_128._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
       ::begin(in_stack_fffffffffffffe98);
  local_130._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
       ::end(in_stack_fffffffffffffe98);
  while (bVar1 = std::__detail::operator!=(&local_128,&local_130), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false>
                        *)0x1f76a1);
    std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>::
    emplace_back<long_const&,double&,long_long&>
              ((vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> *)
               (ppVar2->second).first,(long *)ppVar2->first,(double *)this,(longlong *)in_RDI);
    std::__detail::
    _Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_long,_std::pair<double,_long_long>_>,_false,_false> *
               )in_stack_fffffffffffffea0);
  }
  local_111 = 1;
  std::
  unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
  ::~unordered_map((unordered_map<long,_std::pair<double,_long_long>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::pair<double,_long_long>_>_>_>
                    *)0x1f771e);
  std::
  vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
  ::~vector((vector<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>,_std::allocator<std::future<std::vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>_>_>_>
             *)this);
  return this;
}

Assistant:

std::vector<MCTSResults>
MCTS_cache(const IGame &game, long long iterations)
{
    std::vector<std::future<std::vector<MCTSResults>>> futures;
    int num_threads = std::thread::hardware_concurrency();
    for (int i = 0; i < num_threads; ++i)
        futures.emplace_back(std::async(std::launch::async, [game, iterations] {
            std::unordered_set<GameData<IGame> *, GameDataHash<IGame>, GameDataEqual<IGame>> cache;
            auto game_data = new GameData<IGame>(game);
            cache.insert(game_data);
            for (int i = 0; i < iterations; ++i)
                MCTS_cache_<IGame, RandomPlayout>(cache, game_data);
            std::vector<MCTSResults> results;
            for (auto it : game_data->children)
                results.emplace_back(it.first, it.second->value, it.second->total);
            for (auto it : cache)
                delete it;
            return results;
        }));

    std::unordered_map<game::IMove, std::pair<double, long long>> um_results;
    for (auto &f : futures)
    {
        auto result = f.get();
        for (const auto &r : result)
        {
            auto &p = um_results[r.move];
            p.first += r.value, p.second += r.total;
        }
    }

    std::vector<MCTSResults> results;
    for (auto it : um_results)
        results.emplace_back(it.first, it.second.first, it.second.second);
    return results;
}